

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void SyncTest(void)

{
  __single_object _Var1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint32_t n;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint32_t n_1;
  char *pcVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  uint local_6a4;
  __single_object pTaskManager;
  CChainController chainController;
  lock_guard<sftm::CSpinLock> lock;
  char data [1600];
  
  std::make_unique<sftm::CTaskManager>();
  _Var1 = pTaskManager;
  iVar2 = std::thread::hardware_concurrency();
  sftm::CTaskManager::Start
            ((CTaskManager *)
             _Var1._M_t.
             super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>.
             _M_t.
             super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>.
             super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl,iVar2 - 1);
  poVar3 = std::operator<<((ostream *)&std::cout,"Sync manager started on ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," threads\n");
  _Var1 = pTaskManager;
  poVar3 = std::operator<<((ostream *)&std::cout,"\tTests:\t\t\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\titerations\n");
  lock._M_device =
       (mutex_type *)
       ((long)_Var1._M_t.
              super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>.
              _M_t.
              super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>
              .super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl + 0x102c);
  lVar8 = 0;
  uVar10 = 0xffffffffffffffff;
  uVar9 = 0;
  local_6a4 = 0;
  while( true ) {
    if (lVar8 == 100) break;
    LOCK();
    SyncTest::nExecutedTasks.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0
    ;
    UNLOCK();
    lVar4 = std::chrono::_V2::system_clock::now();
    chainController.m_nCount.super___atomic_base<unsigned_int>._M_i =
         (atomic<unsigned_int>)(__atomic_base<unsigned_int>)0x64;
    for (lVar5 = 8; lVar5 != 0x648; lVar5 = lVar5 + 0x10) {
      *(CChainController **)(data + lVar5) = &chainController;
      *(undefined ***)(data + lVar5 + -8) = &PTR__CTask_00106c68;
    }
    sftm::CSpinLock::lock(lock._M_device);
    iVar2 = *(int *)((long)_Var1._M_t.
                           super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>
                           .super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl + 0x1028
                    );
    uVar7 = iVar2 + 100;
    if (uVar7 < 0x200) {
      pcVar12 = data;
      for (lVar5 = 0; lVar5 != 100; lVar5 = lVar5 + 1) {
        *(char **)((long)_Var1._M_t.
                         super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>
                         .super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl + 0x28 +
                  (ulong)(uint)(iVar2 + (int)lVar5) * 8) = pcVar12;
        pcVar12 = pcVar12 + 0x10;
      }
      *(uint *)((long)_Var1._M_t.
                      super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>
                      .super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl + 0x1028) =
           uVar7;
    }
    *(undefined1 *)
     ((long)_Var1._M_t.
            super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>._M_t
            .super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>.
            super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl + 0x102c) = 0;
    std::condition_variable::notify_all();
    sftm::CWorker::WorkUntil
              ((CWorker *)
               _Var1._M_t.
               super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>
               .super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl,&chainController);
    lVar5 = std::chrono::_V2::system_clock::now();
    uVar6 = (lVar5 - lVar4) / 1000;
    if (SyncTest::nExecutedTasks.super___atomic_base<unsigned_int>._M_i != 0xf69b4) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar3 = std::operator<<(poVar3,"\tPlanned: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,"; Execued: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,";\n");
    }
    local_6a4 = local_6a4 + (uint)uVar6;
    if ((long)(ulong)uVar9 < (long)uVar6) {
      uVar9 = (uint)uVar6;
    }
    if ((long)uVar6 < (long)(uVar10 & 0xffffffff)) {
      uVar10 = uVar6;
    }
    uVar10 = uVar10 & 0xffffffff;
    lVar8 = lVar8 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\tMax time:\t\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\tuS\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"\tAvg time:\t\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\tuS\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"\tMin time:\t\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\tuS\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"\tAvg time on task:\t");
  fVar14 = ((float)(local_6a4 / 100) / 1.0101e+06) * 1000.0;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar14);
  std::operator<<(poVar3,"\tnS\n");
  sftm::CTaskManager::Stop
            ((CTaskManager *)
             pTaskManager._M_t.
             super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>.
             _M_t.
             super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>.
             super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl);
  std::unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>::~unique_ptr
            (&pTaskManager);
  std::operator<<((ostream *)&std::cout,"\nSingle thread the same task start\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"\tTests:\t\t\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\titerations\n");
  uVar10 = 0xffffffffffffffff;
  uVar7 = 0;
  uVar9 = 0;
  iVar2 = 0;
  while( true ) {
    if (iVar2 == 100) break;
    LOCK();
    SyncTest()::nExecutedTasks.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)0;
    UNLOCK();
    iVar11 = 0xf69b4;
    lVar8 = std::chrono::_V2::system_clock::now();
    while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
      LOCK();
      SyncTest()::nExecutedTasks.super___atomic_base<unsigned_int>._M_i =
           (__atomic_base<unsigned_int>)
           ((int)SyncTest()::nExecutedTasks.super___atomic_base<unsigned_int>._M_i + 1);
      UNLOCK();
    }
    lVar5 = std::chrono::_V2::system_clock::now();
    uVar6 = (lVar5 - lVar8) / 1000;
    uVar7 = uVar7 + (uint)uVar6;
    if ((long)(ulong)uVar9 < (long)uVar6) {
      uVar9 = (uint)uVar6;
    }
    if ((long)uVar6 < (long)(uVar10 & 0xffffffff)) {
      uVar10 = uVar6;
    }
    uVar10 = uVar10 & 0xffffffff;
    iVar2 = iVar2 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\tMax time:\t\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\tuS\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"\tAvg time:\t\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\tuS\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"\tMin time:\t\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\tuS\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"\tAvg time on task:\t");
  fVar15 = ((float)(uVar7 / 100) / 1.0101e+06) * 1000.0;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar15);
  std::operator<<(poVar3,"\tnS\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"\t\n\tAverage task overhead:\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar14 - fVar15);
  std::operator<<(poVar3,"\tnS\n");
  return;
}

Assistant:

void SyncTest() noexcept
{
	constexpr std::uint32_t nStartTaskCount = 100;
	constexpr std::uint32_t nMidTaskCount	= 100;
	constexpr std::uint32_t nEndTaskCount	= 100;
	constexpr std::uint32_t nTaskPlanCount	= nStartTaskCount * nMidTaskCount * nEndTaskCount + nMidTaskCount * nEndTaskCount + nEndTaskCount;
	constexpr std::uint32_t nTestCount		= 100;

	float fManagerTaskTime = 0;
	{
		static std::atomic<std::uint32_t> nExecutedTasks = 0;

		class CSyncEndTask : public sftm::CTask
		{
		public:
			CSyncEndTask(sftm::CChainController& chainController) :sftm::CTask(chainController) {}
			virtual ~CSyncEndTask() {}

		public:
			virtual void Execute(sftm::CWorker& worker) noexcept override
			{
				nExecutedTasks++;
			}
		};
		class CSyncMidTask : public sftm::CTask
		{
		public:
			CSyncMidTask(sftm::CChainController& chainController) :sftm::CTask(chainController) {}
			virtual ~CSyncMidTask() {}

		public:
			virtual void Execute(sftm::CWorker& worker) noexcept override
			{
				STACK_MEMORY(CSyncEndTask, nEndTaskCount);
				sftm::CChainController chainController(nEndTaskCount);
				for (std::uint32_t n = 0; n < nEndTaskCount; n++)
					new(pAddress + n) CSyncEndTask(chainController);

				worker.PushTask(pAddress, nEndTaskCount);
				worker.WorkUntil(chainController);

				nExecutedTasks++;
			}
		};
		class CSyncStartTask : public sftm::CTask
		{
		public:
			CSyncStartTask(sftm::CChainController& chainController) :sftm::CTask(chainController) {}
			virtual ~CSyncStartTask() {}

		public:
			virtual void Execute(sftm::CWorker& worker) noexcept override
			{
				STACK_MEMORY(CSyncMidTask, nMidTaskCount);
				sftm::CChainController chainController(nMidTaskCount);
				for (std::uint32_t n = 0; n < nMidTaskCount; ++n)
					new(pAddress + n) CSyncMidTask(chainController);

				worker.PushTask(pAddress, nMidTaskCount);
				worker.WorkUntil(chainController);

				nExecutedTasks++;
			}
		};

		auto pTaskManager(std::make_unique<sftm::CTaskManager>());
		
		pTaskManager->Start(std::thread::hardware_concurrency() - 1);
		std::cout << "Sync manager started on " << pTaskManager->GetWorkersCount() << " threads\n";

		auto& currentWorker = pTaskManager->GetMainWorker();

		std::cout << "	Tests:			" << nTestCount << "	iterations\n";

		std::uint32_t nAverageTime = 0, nMaxTime = 0, nMinTime = 0xFFFFFFFF;

		for (std::uint32_t n = 0; n < nTestCount; ++n)
		{
			nExecutedTasks.store(0);

			auto t1 = std::chrono::high_resolution_clock::now();

			STACK_MEMORY(CSyncStartTask, nStartTaskCount);
			sftm::CChainController chainController(nStartTaskCount);
			for (std::uint32_t n = 0; n < nStartTaskCount; ++n)
				new(pAddress + n) CSyncStartTask(chainController);

			currentWorker.PushTask(pAddress, nStartTaskCount);
			currentWorker.WorkUntil(chainController);

			auto t2 = std::chrono::high_resolution_clock::now();
			auto nUsCount = std::chrono::duration_cast<std::chrono::microseconds>(t2 - t1).count();
			if(nTaskPlanCount != nExecutedTasks)
				std::cout << n << "	Planned: " << nTaskPlanCount << "; Execued: " << nExecutedTasks << ";\n";

			nAverageTime += nUsCount;
			if (nMaxTime < nUsCount)
				nMaxTime = nUsCount;
			if (nMinTime > nUsCount)
				nMinTime = nUsCount;
		}

		auto nAvarageTime		= nAverageTime / nTestCount;
		fManagerTaskTime = (float)nAvarageTime / (float)nTaskPlanCount * 1000.0f;
		std::cout << "	Max time:		"		<< nMaxTime				<<	"	uS\n";
		std::cout << "	Avg time:		"		<< nAvarageTime			<<	"	uS\n";
		std::cout << "	Min time:		"		<< nMinTime				<<	"	uS\n";
		std::cout << "	Avg time on task:	"	<< fManagerTaskTime		<< "	nS\n";
	
		pTaskManager->Stop();
	}

	float fSingleThreadTime = 0;
	{
		std::cout << "\nSingle thread the same task start\n";

		std::cout << "	Tests:			" << nTestCount << "	iterations\n";

		static std::atomic<std::uint32_t> nExecutedTasks = 0;
		std::uint32_t nAverageTime = 0, nMaxTime = 0, nMinTime = 0xFFFFFFFF;

		for (std::uint32_t n = 0; n < nTestCount; ++n)
		{
			nExecutedTasks.store(0);

			auto tl1 = std::chrono::high_resolution_clock::now();

			for (std::uint32_t n = 0; n < nTaskPlanCount; ++n)
				++nExecutedTasks;

			auto tl2 = std::chrono::high_resolution_clock::now();
			auto nUsCount = std::chrono::duration_cast<std::chrono::microseconds>(tl2 - tl1).count();

			nAverageTime += nUsCount;
			if (nMaxTime < nUsCount)
				nMaxTime = nUsCount;
			if (nMinTime > nUsCount)
				nMinTime = nUsCount;
		}

		auto nAvarageTime = nAverageTime / nTestCount;
		fSingleThreadTime = (float)nAvarageTime / (float)nTaskPlanCount * 1000.0f;
		std::cout << "	Max time:		"		<< nMaxTime				<< "	uS\n";
		std::cout << "	Avg time:		"		<< nAvarageTime			<< "	uS\n";
		std::cout << "	Min time:		"		<< nMinTime				<< "	uS\n";
		std::cout << "	Avg time on task:	"	<< fSingleThreadTime	<< "	nS\n";
	}

	std::cout << "	\n	Average task overhead:	" << fManagerTaskTime - fSingleThreadTime <<"	nS\n";

}